

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengineex.cpp
# Opt level: O1

void __thiscall QPaintEngineEx::stroke(QPaintEngineEx *this,QVectorPath *path,QPen *inPen)

{
  QRegionPrivate **ppQVar1;
  QPointF *pQVar2;
  DataPointer *pDVar3;
  QPen *pQVar4;
  ElementType EVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  QPaintEnginePrivate *pQVar8;
  undefined4 uVar11;
  undefined4 uVar12;
  QRegionData *pQVar9;
  QStrokerOps *this_00;
  QRegionPrivate *pQVar10;
  double dVar13;
  int iVar14;
  Data *pDVar15;
  QRect *pQVar16;
  Data *pDVar17;
  QRect *pQVar18;
  Data *pDVar19;
  QRect *pQVar20;
  bool bVar21;
  PenStyle PVar22;
  int iVar23;
  PenJoinStyle PVar24;
  LineJoinMode LVar25;
  PenCapStyle PVar26;
  TransformationType TVar27;
  QDataBuffer<double> *this_01;
  undefined1 *puVar28;
  undefined1 *puVar29;
  QPaintEngineState *pQVar30;
  QPaintEnginePrivate *pQVar31;
  qreal *pqVar32;
  QPaintEngineState *pQVar33;
  undefined8 *puVar34;
  PenStyle *pPVar35;
  QTransform *pQVar36;
  QTransform *pQVar37;
  QRectF *pQVar38;
  long lVar39;
  ElementType *pEVar40;
  QVectorPath *this_02;
  QPointF *pQVar41;
  long in_FS_OFFSET;
  byte bVar42;
  ulong uVar43;
  qreal qVar44;
  double dVar45;
  _func_int **pp_Var46;
  double dVar47;
  QColor QVar48;
  QPointF QVar49;
  QPointF QVar50;
  QPointF QVar51;
  QBrush brush;
  QPen pen;
  QPainterPath painterPath;
  QTransform xform;
  uint local_1fc;
  undefined1 local_198 [24];
  QRegionPrivate *pQStack_180;
  undefined1 local_178 [16];
  undefined1 local_168 [20];
  uint uStack_154;
  double local_150;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  CacheEntry *local_130;
  QRectF local_128 [2];
  QTransform local_d8;
  QTransform local_88;
  long local_38;
  
  bVar42 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (path->m_points == (qreal *)0x0) goto LAB_003d0216;
  pQVar8 = (this->super_QPaintEngine).d_ptr.d;
  if (pQVar8[3].baseSystemClip.d == (QRegionData *)0x0) {
    this_01 = (QDataBuffer<double> *)operator_new(0x30);
    lVar39 = (long)path->m_count + 4;
    QDataBuffer<double>::QDataBuffer(this_01,lVar39);
    QDataBuffer<QPainterPath::ElementType>::QDataBuffer
              ((QDataBuffer<QPainterPath::ElementType> *)(this_01 + 1),lVar39);
    pQVar8[3].baseSystemClip.d = (QRegionData *)this_01;
    pQVar8[1].systemTransform.m_matrix[1][0] = (qreal)qpaintengineex_moveTo;
    pQVar8[1].systemTransform.m_matrix[1][1] = (qreal)qpaintengineex_lineTo;
    pQVar8[1].systemTransform.m_matrix[1][2] = (qreal)qpaintengineex_cubicTo;
  }
  stack0xfffffffffffffe78 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_198._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPen::QPen((QPen *)(local_198 + 8),inPen);
  PVar22 = QPen::style((QPen *)(local_198 + 8));
  if (1 < (int)PVar22) {
    local_d8.m_matrix[0][2]._0_4_ = 0xffffffff;
    local_d8.m_matrix[0][2]._4_4_ = 0xffffffff;
    local_d8.m_matrix[1][0]._0_4_ = 0xffffffff;
    local_d8.m_matrix[1][0]._4_4_ = 0xffffffff;
    local_d8.m_matrix[0][0] = -NAN;
    local_d8.m_matrix[0][1] = -NAN;
    QVectorPath::controlPointRect(path);
    pQVar33 = (this->super_QPaintEngine).state;
    pQVar30 = pQVar33 + -2;
    if (pQVar33 == (QPaintEngineState *)0x0) {
      pQVar30 = (QPaintEngineState *)0x0;
    }
    bVar21 = QPen::isCosmetic((QPen *)(local_198 + 8));
    if (bVar21) {
      uVar6 = pQVar8[3].systemRect.x2;
      uVar11 = pQVar8[3].systemRect.y2;
      pQStack_180 = (QRegionPrivate *)(double)(int)uVar11;
      local_198._16_8_ = (double)(int)uVar6;
      local_178._8_8_ =
           (double)(((long)*(int *)((long)&pQVar8[3].systemViewport.d + 4) - (long)(int)uVar11) + 1)
      ;
      local_178._0_8_ = (double)(((long)*(int *)&pQVar8[3].systemViewport.d - (long)(int)uVar6) + 1)
      ;
      local_d8.m_matrix[0][0] = *(double *)(pQVar30 + 0x42) + local_d8.m_matrix[0][0];
      local_d8.m_matrix[0][1] = *(double *)(pQVar30 + 0x44) + local_d8.m_matrix[0][1];
    }
    else {
      QTransform::inverted(&local_88,(QTransform *)(pQVar30 + 0x36),(bool *)0x0);
      uVar7 = pQVar8[3].systemRect.x2;
      uVar12 = pQVar8[3].systemRect.y2;
      local_168._0_8_ = (undefined8)(int)uVar7;
      local_168._8_8_ = (undefined8)(int)uVar12;
      register0x00001240 =
           (double)(((long)*(int *)&pQVar8[3].systemViewport.d - (long)(int)uVar7) + 1);
      local_150 = (double)(((long)*(int *)((long)&pQVar8[3].systemViewport.d + 4) -
                           (long)(int)uVar12) + 1);
      QTransform::mapRect(local_128,&local_88,(QRectF *)local_168);
      local_178._8_8_ = local_128[0].h;
      local_178._0_8_ = local_128[0].w;
      pQStack_180 = (QRegionPrivate *)local_128[0].yp;
      local_198._16_8_ = local_128[0].xp;
    }
    qVar44 = QPen::widthF((QPen *)(local_198 + 8));
    if ((qVar44 != 0.0) || (NAN(qVar44))) {
      qVar44 = QPen::widthF((QPen *)(local_198 + 8));
    }
    else {
      qVar44 = 1.0;
    }
    local_88.m_matrix[0][2] = -NAN;
    local_88.m_matrix[1][0]._0_4_ = 0xffffffff;
    local_88.m_matrix[1][0]._4_4_ = 0xffffffff;
    local_88.m_matrix[0][0] = -NAN;
    local_88.m_matrix[0][1] = -NAN;
    local_128[0].xp = local_d8.m_matrix[0][0] - qVar44;
    local_128[0].yp = local_d8.m_matrix[0][1] - qVar44;
    local_128[0].w =
         (double)CONCAT44(local_d8.m_matrix[0][2]._4_4_,local_d8.m_matrix[0][2]._0_4_) + qVar44 +
         qVar44;
    local_128[0].h =
         (double)CONCAT44(local_d8.m_matrix[1][0]._4_4_,local_d8.m_matrix[1][0]._0_4_) + qVar44 +
         qVar44;
    QRectF::operator&((QRectF *)&local_88,local_128);
    dVar45 = (double)CONCAT44(local_88.m_matrix[1][0]._4_4_,local_88.m_matrix[1][0]._0_4_);
    if ((double)CONCAT44(local_88.m_matrix[1][0]._4_4_,local_88.m_matrix[1][0]._0_4_) <=
        local_88.m_matrix[0][2]) {
      dVar45 = local_88.m_matrix[0][2];
    }
    local_128[0].w = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_128[0].xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_128[0].yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QPen::dashPattern((QList<double> *)local_128,(QPen *)(local_198 + 8));
    dVar47 = 0.0;
    if ((undefined1 *)local_128[0].w != (undefined1 *)0x0) {
      puVar28 = (undefined1 *)0x20;
      if ((long)local_128[0].w < 0x20) {
        puVar28 = (undefined1 *)local_128[0].w;
      }
      puVar29 = (undefined1 *)0x0;
      do {
        dVar13 = 0.0;
        if (0.0 <= *(double *)((long)local_128[0].yp + (long)puVar29 * 8)) {
          dVar13 = *(double *)((long)local_128[0].yp + (long)puVar29 * 8);
        }
        dVar47 = dVar47 + dVar13;
        puVar29 = puVar29 + 1;
      } while (puVar28 != puVar29);
    }
    dVar47 = qVar44 * dVar47;
    uVar43 = -(ulong)(dVar47 < -dVar47);
    if ((double)(~uVar43 & (ulong)dVar47 | (ulong)-dVar47 & uVar43) <= 1e-12) {
      QPen::setStyle((QPen *)(local_198 + 8),NoPen);
    }
    else if (10000.0 < dVar45 / dVar47) {
      pQVar4 = (QPen *)(local_198 + 8);
      QPen::setStyle(pQVar4,SolidLine);
      local_168._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_168._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QVar48 = QPen::color(pQVar4);
      local_168._0_8_ = QVar48._0_8_;
      local_168._8_6_ = QVar48.ct._4_6_;
      iVar23 = QColor::alpha((QColor *)local_168);
      QColor::setAlpha((QColor *)local_168,iVar23 / 2);
      QPen::setColor(pQVar4,(QColor *)local_168);
    }
    if ((QArrayData *)local_128[0].xp != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_128[0].xp)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_128[0].xp)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_128[0].xp)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_128[0].xp,8,0x10);
      }
    }
  }
  if ((undefined1 *)local_198._8_8_ != *(undefined1 **)&pQVar8[3].systemRect) {
    pQVar4 = (QPen *)(local_198 + 8);
    QPen::operator=((QPen *)&pQVar8[3].systemRect,pQVar4);
    PVar24 = QPen::joinStyle(pQVar4);
    LVar25 = QStroker::joinModeForJoin(PVar24);
    *(LineJoinMode *)((long)pQVar8[1].systemTransform.m_matrix[2] + 0x14) = LVar25;
    PVar26 = QPen::capStyle(pQVar4);
    LVar25 = QStroker::joinModeForCap(PVar26);
    *(LineJoinMode *)(pQVar8[1].systemTransform.m_matrix[2] + 2) = LVar25;
    qVar44 = QPen::miterLimit(pQVar4);
    pQVar8[1].systemTransform.m_matrix[2][1] = qVar44;
    qVar44 = QPen::widthF(pQVar4);
    if ((qVar44 != 0.0) || (NAN(qVar44))) {
      pQVar8[1].systemTransform.m_matrix[2][0] = qVar44;
      dVar45 = 0.25;
      if (1.0 / qVar44 <= 0.25) {
        dVar45 = 1.0 / qVar44;
      }
      if (dVar45 <= 0.00025) {
        dVar45 = 0.00025;
      }
    }
    else {
      pQVar8[1].systemTransform.m_matrix[2][0] = 1.0;
      dVar45 = 0.25;
    }
    pQVar8[1].systemTransform.m_matrix[0][0] = dVar45;
    PVar22 = QPen::style((QPen *)(local_198 + 8));
    if (PVar22 == SolidLine) {
      pQVar31 = pQVar8 + 1;
    }
    else if (PVar22 == NoPen) {
      pQVar31 = (QPaintEnginePrivate *)0x0;
    }
    else {
      QPen::dashPattern((QList<double> *)&local_88,(QPen *)(local_198 + 8));
      QArrayDataPointer<double>::operator=
                ((QArrayDataPointer<double> *)&pQVar8[2].systemTransform.field_0x48,
                 (QArrayDataPointer<double> *)&local_88);
      if ((QRegionPrivate *)local_88.m_matrix[0][0] != (QRegionPrivate *)0x0) {
        LOCK();
        *(int *)local_88.m_matrix[0][0] = *(int *)local_88.m_matrix[0][0] + -1;
        UNLOCK();
        if (*(int *)local_88.m_matrix[0][0] == 0) {
          QArrayData::deallocate((QArrayData *)local_88.m_matrix[0][0],8,0x10);
        }
      }
      pQVar31 = (QPaintEnginePrivate *)&pQVar8[2].q_ptr;
      pp_Var46 = (_func_int **)QPen::dashOffset((QPen *)(local_198 + 8));
      pQVar8[3]._vptr_QPaintEnginePrivate = pp_Var46;
    }
    pQVar8[3].systemClip.d = (QRegionData *)pQVar31;
  }
  pQVar9 = pQVar8[3].systemClip.d;
  if (pQVar9 != (QRegionData *)0x0) {
    if (((((double)local_178._0_8_ != 0.0) || (NAN((double)local_178._0_8_))) ||
        ((double)local_178._8_8_ != 0.0)) || (NAN((double)local_178._8_8_))) {
      *(undefined8 *)(pQVar9 + 3) = local_178._0_8_;
      pQVar9[3].qt_rgn = (QRegionPrivate *)local_178._8_8_;
      *(undefined8 *)(pQVar9 + 2) = local_198._16_8_;
      pQVar9[2].qt_rgn = pQStack_180;
    }
    if ((QPaintEnginePrivate *)pQVar8[3].systemClip.d == pQVar8 + 1) {
      *(byte *)&pQVar8[2].pdev = (byte)(path->m_hints >> 0xf) & 1;
    }
    pEVar40 = path->m_elements;
    pQVar41 = (QPointF *)path->m_points;
    iVar23 = path->m_count;
    iVar14 = iVar23 * 2;
    pQVar9 = pQVar8[3].baseSystemClip.d;
    *(undefined8 *)(pQVar9 + 2) = 0;
    pQVar9->qt_rgn = (QRegionPrivate *)0x0;
    local_1fc = (uint)(2 < iVar23) * 2 + 0x2000;
    PVar26 = QStroker::capForJoinMode(*(LineJoinMode *)(pQVar8[1].systemTransform.m_matrix[2] + 2));
    if ((PVar26 == RoundCap) ||
       (PVar24 = QStroker::joinForJoinMode
                           (*(LineJoinMode *)((long)pQVar8[1].systemTransform.m_matrix[2] + 0x14)),
       PVar24 == RoundJoin)) {
      local_1fc = local_1fc | 4;
    }
    pQVar2 = (QPointF *)(&pQVar41->xp + iVar14);
    bVar21 = QPen::isCosmetic((QPen *)(local_198 + 8));
    if (bVar21) {
      pQVar33 = (this->super_QPaintEngine).state;
      pQVar30 = pQVar33 + -2;
      if (pQVar33 == (QPaintEngineState *)0x0) {
        pQVar30 = (QPaintEngineState *)0x0;
      }
      TVar27 = QTransform::type((QTransform *)(pQVar30 + 0x36));
      if ((int)TVar27 < 0x10) {
        pQVar9 = pQVar8[3].systemClip.d;
        pqVar32 = (qreal *)&DAT_006af238;
        pQVar37 = &local_88;
        for (lVar39 = 9; lVar39 != 0; lVar39 = lVar39 + -1) {
          pQVar37->m_matrix[0][0] = *pqVar32;
          pqVar32 = pqVar32 + (ulong)bVar42 * -2 + 1;
          pQVar37 = (QTransform *)((long)pQVar37 + ((ulong)bVar42 * -2 + 1) * 8);
        }
        local_88._72_2_ = local_88._72_2_ & 0xfc00;
        local_d8.m_matrix[0][0] = -NAN;
        qt_scaleForTransform(&local_88,(qreal *)&local_d8);
        pQVar9[4].qt_rgn =
             (QRegionPrivate *)
             (-(ulong)(local_d8.m_matrix[0][0] == 0.0) & 0x3fe0000000000000 |
             ~-(ulong)(local_d8.m_matrix[0][0] == 0.0) & (ulong)(0.5 / local_d8.m_matrix[0][0]));
        pQVar9 = pQVar8[3].systemClip.d;
        (**(code **)(*(long *)pQVar9 + 0x10))(pQVar9,pQVar8[3].baseSystemClip.d);
        if (pEVar40 == (ElementType *)0x0) {
          pQVar33 = (this->super_QPaintEngine).state;
          pQVar30 = pQVar33 + -2;
          if (pQVar33 == (QPaintEngineState *)0x0) {
            pQVar30 = (QPaintEngineState *)0x0;
          }
          QVar49 = QTransform::map((QTransform *)(pQVar30 + 0x36),pQVar41);
          pQVar9 = pQVar8[3].systemClip.d;
          if (1 < *(long *)(pQVar9 + 1)) {
            (**(code **)(*(long *)pQVar9 + 0x20))(pQVar9);
          }
          *(long *)(pQVar9 + 1) = 0;
          QDataBuffer<QStrokerOps::Element>::reserve
                    ((QDataBuffer<QStrokerOps::Element> *)&pQVar9->qt_rgn,1);
          lVar39 = *(long *)(pQVar9 + 1);
          pQVar10 = pQVar9[1].qt_rgn;
          *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000000;
          (&pQVar10->rects)[lVar39].d.d = (Data *)QVar49.xp;
          (&pQVar10->rects)[lVar39].d.ptr = (QRect *)QVar49.yp;
          *(long *)(pQVar9 + 1) = *(long *)(pQVar9 + 1) + 1;
          if (2 < iVar14) {
            pQVar41 = pQVar41 + 1;
            do {
              pQVar33 = (this->super_QPaintEngine).state;
              pQVar30 = pQVar33 + -2;
              if (pQVar33 == (QPaintEngineState *)0x0) {
                pQVar30 = (QPaintEngineState *)0x0;
              }
              QVar50 = QTransform::map((QTransform *)(pQVar30 + 0x36),pQVar41);
              pQVar9 = pQVar8[3].systemClip.d;
              QDataBuffer<QStrokerOps::Element>::reserve
                        ((QDataBuffer<QStrokerOps::Element> *)&pQVar9->qt_rgn,
                         *(long *)(pQVar9 + 1) + 1);
              lVar39 = *(long *)(pQVar9 + 1);
              pQVar10 = pQVar9[1].qt_rgn;
              *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000001;
              (&pQVar10->rects)[lVar39].d.d = (Data *)QVar50.xp;
              (&pQVar10->rects)[lVar39].d.ptr = (QRect *)QVar50.yp;
              *(long *)(pQVar9 + 1) = *(long *)(pQVar9 + 1) + 1;
              pQVar41 = pQVar41 + 1;
            } while (pQVar41 < pQVar2);
          }
          if ((path->m_hints & 0x4000) != 0) {
            QStrokerOps::lineTo((QStrokerOps *)pQVar8[3].systemClip.d,(qfixed)QVar49.xp,
                                (qfixed)QVar49.yp);
          }
        }
        else {
          if (0 < iVar14) {
            do {
              EVar5 = *pEVar40;
              if (EVar5 == CurveToElement) {
                pQVar33 = (this->super_QPaintEngine).state;
                pQVar30 = pQVar33 + -2;
                if (pQVar33 == (QPaintEngineState *)0x0) {
                  pQVar30 = (QPaintEngineState *)0x0;
                }
                QVar49 = QTransform::map((QTransform *)(pQVar30 + 0x36),pQVar41);
                pQVar30 = (this->super_QPaintEngine).state;
                if (pQVar30 != (QPaintEngineState *)0x0) {
                  pQVar30 = pQVar30 + -2;
                }
                QVar50 = QTransform::map((QTransform *)(pQVar30 + 0x36),pQVar41 + 1);
                pQVar30 = (this->super_QPaintEngine).state;
                if (pQVar30 != (QPaintEngineState *)0x0) {
                  pQVar30 = pQVar30 + -2;
                }
                QVar51 = QTransform::map((QTransform *)(pQVar30 + 0x36),pQVar41 + 2);
                pQVar9 = pQVar8[3].systemClip.d;
                ppQVar1 = &pQVar9->qt_rgn;
                QDataBuffer<QStrokerOps::Element>::reserve
                          ((QDataBuffer<QStrokerOps::Element> *)ppQVar1,*(long *)(pQVar9 + 1) + 1);
                lVar39 = *(long *)(pQVar9 + 1);
                pQVar10 = pQVar9[1].qt_rgn;
                *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000002;
                (&pQVar10->rects)[lVar39].d.d = (Data *)QVar49.xp;
                (&pQVar10->rects)[lVar39].d.ptr = (QRect *)QVar49.yp;
                lVar39 = *(long *)(pQVar9 + 1);
                *(long *)(pQVar9 + 1) = lVar39 + 1;
                QDataBuffer<QStrokerOps::Element>::reserve
                          ((QDataBuffer<QStrokerOps::Element> *)ppQVar1,lVar39 + 2);
                lVar39 = *(long *)(pQVar9 + 1);
                pQVar10 = pQVar9[1].qt_rgn;
                *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000003;
                (&pQVar10->rects)[lVar39].d.d = (Data *)QVar50.xp;
                (&pQVar10->rects)[lVar39].d.ptr = (QRect *)QVar50.yp;
                lVar39 = *(long *)(pQVar9 + 1);
                *(long *)(pQVar9 + 1) = lVar39 + 1;
                QDataBuffer<QStrokerOps::Element>::reserve
                          ((QDataBuffer<QStrokerOps::Element> *)ppQVar1,lVar39 + 2);
                lVar39 = *(long *)(pQVar9 + 1);
                pQVar10 = pQVar9[1].qt_rgn;
                *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000003;
                (&pQVar10->rects)[lVar39].d.d = (Data *)QVar51.xp;
                (&pQVar10->rects)[lVar39].d.ptr = (QRect *)QVar51.yp;
                *(long *)(pQVar9 + 1) = *(long *)(pQVar9 + 1) + 1;
                pQVar41 = pQVar41 + 3;
                pEVar40 = pEVar40 + 3;
                local_1fc = local_1fc | 4;
              }
              else {
                if (EVar5 == LineToElement) {
                  pQVar33 = (this->super_QPaintEngine).state;
                  pQVar30 = pQVar33 + -2;
                  if (pQVar33 == (QPaintEngineState *)0x0) {
                    pQVar30 = (QPaintEngineState *)0x0;
                  }
                  QVar49 = QTransform::map((QTransform *)(pQVar30 + 0x36),pQVar41);
                  pQVar9 = pQVar8[3].systemClip.d;
                  QDataBuffer<QStrokerOps::Element>::reserve
                            ((QDataBuffer<QStrokerOps::Element> *)&pQVar9->qt_rgn,
                             *(long *)(pQVar9 + 1) + 1);
                  lVar39 = *(long *)(pQVar9 + 1);
                  pQVar10 = pQVar9[1].qt_rgn;
                  *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000001;
                  (&pQVar10->rects)[lVar39].d.d = (Data *)QVar49.xp;
                  (&pQVar10->rects)[lVar39].d.ptr = (QRect *)QVar49.yp;
                  *(long *)(pQVar9 + 1) = *(long *)(pQVar9 + 1) + 1;
                }
                else {
                  if (EVar5 != MoveToElement) goto LAB_003cfc88;
                  pQVar33 = (this->super_QPaintEngine).state;
                  pQVar30 = pQVar33 + -2;
                  if (pQVar33 == (QPaintEngineState *)0x0) {
                    pQVar30 = (QPaintEngineState *)0x0;
                  }
                  QVar49 = QTransform::map((QTransform *)(pQVar30 + 0x36),pQVar41);
                  pQVar9 = pQVar8[3].systemClip.d;
                  if (1 < *(long *)(pQVar9 + 1)) {
                    (**(code **)(*(long *)pQVar9 + 0x20))(pQVar9);
                  }
                  *(long *)(pQVar9 + 1) = 0;
                  QDataBuffer<QStrokerOps::Element>::reserve
                            ((QDataBuffer<QStrokerOps::Element> *)&pQVar9->qt_rgn,1);
                  lVar39 = *(long *)(pQVar9 + 1);
                  pQVar10 = pQVar9[1].qt_rgn;
                  *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000000;
                  (&pQVar10->rects)[lVar39].d.d = (Data *)QVar49.xp;
                  (&pQVar10->rects)[lVar39].d.ptr = (QRect *)QVar49.yp;
                  *(long *)(pQVar9 + 1) = *(long *)(pQVar9 + 1) + 1;
                }
                pQVar41 = pQVar41 + 1;
                pEVar40 = pEVar40 + 1;
              }
LAB_003cfc88:
            } while (pQVar41 < pQVar2);
          }
          if ((path->m_hints & 0x4000) != 0) {
            pQVar33 = (this->super_QPaintEngine).state;
            pQVar30 = pQVar33 + -2;
            if (pQVar33 == (QPaintEngineState *)0x0) {
              pQVar30 = (QPaintEngineState *)0x0;
            }
            QVar49 = QTransform::map((QTransform *)(pQVar30 + 0x36),(QPointF *)path->m_points);
            pQVar9 = pQVar8[3].systemClip.d;
            QDataBuffer<QStrokerOps::Element>::reserve
                      ((QDataBuffer<QStrokerOps::Element> *)&pQVar9->qt_rgn,
                       *(long *)(pQVar9 + 1) + 1);
            lVar39 = *(long *)(pQVar9 + 1);
            pQVar10 = pQVar9[1].qt_rgn;
            *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000001;
            (&pQVar10->rects)[lVar39].d.d = (Data *)QVar49.xp;
            (&pQVar10->rects)[lVar39].d.ptr = (QRect *)QVar49.yp;
            *(long *)(pQVar9 + 1) = *(long *)(pQVar9 + 1) + 1;
          }
        }
        (**(code **)(*(long *)pQVar8[3].systemClip.d + 0x18))();
      }
      else {
        local_d8.m_matrix[0][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        pQVar33 = (this->super_QPaintEngine).state;
        pQVar30 = pQVar33 + -2;
        if (pQVar33 == (QPaintEngineState *)0x0) {
          pQVar30 = (QPaintEngineState *)0x0;
        }
        QVectorPath::convertToPainterPath((QVectorPath *)&local_88);
        QTransform::map(&local_d8,(QPainterPath *)(pQVar30 + 0x36));
        QPainterPath::~QPainterPath((QPainterPath *)&local_88);
        pQVar9 = pQVar8[3].baseSystemClip.d;
        this_00 = (QStrokerOps *)pQVar8[3].systemClip.d;
        pqVar32 = (qreal *)&DAT_006af238;
        pQVar37 = &local_88;
        for (lVar39 = 9; lVar39 != 0; lVar39 = lVar39 + -1) {
          pQVar37->m_matrix[0][0] = *pqVar32;
          pqVar32 = pqVar32 + (ulong)bVar42 * -2 + 1;
          pQVar37 = (QTransform *)((long)pQVar37 + ((ulong)bVar42 * -2 + 1) * 8);
        }
        local_88._72_2_ = local_88._72_2_ & 0xfc00;
        QStrokerOps::strokePath(this_00,(QPainterPath *)&local_d8,pQVar9,&local_88);
        QPainterPath::~QPainterPath((QPainterPath *)&local_d8);
      }
      local_150 = -NAN;
      uStack_148 = 0xffffffff;
      uStack_144 = 0xffffffff;
      local_140 = 0xffffffff;
      uStack_13c = 0xffffffff;
      uStack_138 = 0xffffffff;
      uStack_134 = 0xffffffff;
      local_130 = (CacheEntry *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar9 = pQVar8[3].baseSystemClip.d;
      local_168._8_8_ = *(undefined8 *)(pQVar9 + 1);
      local_168._0_8_ = pQVar9[2].qt_rgn;
      stack0xfffffffffffffea8 =
           (double)CONCAT44(local_1fc,pQVar9[2].ref.atomic._q_value.super___atomic_base<int>._M_i);
      puVar34 = &DAT_006af1b8;
      pQVar37 = &local_88;
      for (lVar39 = 10; lVar39 != 0; lVar39 = lVar39 + -1) {
        pQVar37->m_matrix[0][0] = *puVar34;
        puVar34 = puVar34 + (ulong)bVar42 * -2 + 1;
        pQVar37 = (QTransform *)((long)pQVar37 + ((ulong)bVar42 * -2 + 1) * 8);
      }
      pQVar33 = (this->super_QPaintEngine).state;
      pQVar30 = pQVar33 + -2;
      if (pQVar33 == (QPaintEngineState *)0x0) {
        pQVar30 = (QPaintEngineState *)0x0;
      }
      pQVar33 = pQVar30 + 0x36;
      pQVar37 = &local_88;
      for (lVar39 = 10; lVar39 != 0; lVar39 = lVar39 + -1) {
        pQVar37->m_matrix[0][0] = *(undefined8 *)pQVar33;
        pQVar33 = pQVar33 + (ulong)bVar42 * -4 + 2;
        pQVar37 = (QTransform *)((long)pQVar37 + ((ulong)bVar42 * -2 + 1) * 8);
      }
      puVar34 = &DAT_006af238;
      pQVar33 = pQVar30 + 0x36;
      for (lVar39 = 9; lVar39 != 0; lVar39 = lVar39 + -1) {
        *(undefined8 *)pQVar33 = *puVar34;
        puVar34 = puVar34 + (ulong)bVar42 * -2 + 1;
        pQVar33 = pQVar33 + (ulong)bVar42 * -4 + 2;
      }
      *(undefined2 *)
       &pQVar30[0x48].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
        super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = 0;
      (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x27])(this);
      local_198._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPen::brush((QPen *)local_198);
      if (*(int *)(local_198._0_8_ + 4) != 1) {
        pPVar35 = (PenStyle *)(local_198._0_8_ + 0x18);
        pQVar38 = local_128;
        for (lVar39 = 10; lVar39 != 0; lVar39 = lVar39 + -1) {
          (*(qreal (*) [3])&pQVar38->xp)[0] = *(qreal *)pPVar35;
          pPVar35 = pPVar35 + (ulong)bVar42 * -4 + 2;
          pQVar38 = (QRectF *)((long)pQVar38 + ((ulong)bVar42 * -2 + 1) * 8);
        }
        QTransform::operator*(&local_d8,(QTransform *)local_128,&local_88);
        QBrush::setTransform((QBrush *)local_198,&local_d8);
      }
      this_02 = (QVectorPath *)local_168;
      pQVar37 = (QTransform *)local_198;
      (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x1a])(this,this_02,pQVar37);
      pQVar33 = (this->super_QPaintEngine).state;
      pQVar30 = pQVar33 + -2;
      if (pQVar33 == (QPaintEngineState *)0x0) {
        pQVar30 = (QPaintEngineState *)0x0;
      }
      pQVar36 = &local_88;
      pQVar33 = pQVar30 + 0x36;
      for (lVar39 = 9; lVar39 != 0; lVar39 = lVar39 + -1) {
        *(undefined8 *)pQVar33 = pQVar36->m_matrix[0][0];
        pQVar36 = (QTransform *)((long)pQVar36 + ((ulong)bVar42 * -2 + 1) * 8);
        pQVar33 = pQVar33 + (ulong)bVar42 * -4 + 2;
      }
      *(undefined2 *)
       &pQVar30[0x48].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
        super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = local_88._72_2_;
      (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x27])(this);
    }
    else {
      pQVar33 = (this->super_QPaintEngine).state;
      pQVar30 = pQVar33 + -2;
      if (pQVar33 == (QPaintEngineState *)0x0) {
        pQVar30 = (QPaintEngineState *)0x0;
      }
      pQVar9 = pQVar8[3].systemClip.d;
      local_88.m_matrix[0][0] = -NAN;
      qt_scaleForTransform((QTransform *)(pQVar30 + 0x36),(qreal *)&local_88);
      pQVar9[4].qt_rgn =
           (QRegionPrivate *)
           (-(ulong)(local_88.m_matrix[0][0] == 0.0) & 0x3fe0000000000000 |
           ~-(ulong)(local_88.m_matrix[0][0] == 0.0) & (ulong)(0.5 / local_88.m_matrix[0][0]));
      pQVar9 = pQVar8[3].systemClip.d;
      (**(code **)(*(long *)pQVar9 + 0x10))(pQVar9,pQVar8[3].baseSystemClip.d);
      if (pEVar40 == (ElementType *)0x0) {
        pQVar9 = pQVar8[3].systemClip.d;
        pDVar15 = (Data *)pQVar41->xp;
        pQVar16 = (QRect *)pQVar41->yp;
        if (1 < *(long *)(pQVar9 + 1)) {
          (**(code **)(*(long *)pQVar9 + 0x20))(pQVar9);
        }
        *(long *)(pQVar9 + 1) = 0;
        QDataBuffer<QStrokerOps::Element>::reserve
                  ((QDataBuffer<QStrokerOps::Element> *)&pQVar9->qt_rgn,1);
        lVar39 = *(long *)(pQVar9 + 1);
        pQVar10 = pQVar9[1].qt_rgn;
        *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000000;
        pDVar3 = &(&pQVar10->rects)[lVar39].d;
        pDVar3->d = pDVar15;
        pDVar3->ptr = pQVar16;
        *(long *)(pQVar9 + 1) = *(long *)(pQVar9 + 1) + 1;
        if (2 < iVar14) {
          pQVar41 = pQVar41 + 1;
          do {
            pQVar9 = pQVar8[3].systemClip.d;
            pDVar15 = (Data *)pQVar41->xp;
            pQVar16 = (QRect *)pQVar41->yp;
            QDataBuffer<QStrokerOps::Element>::reserve
                      ((QDataBuffer<QStrokerOps::Element> *)&pQVar9->qt_rgn,
                       *(long *)(pQVar9 + 1) + 1);
            lVar39 = *(long *)(pQVar9 + 1);
            pQVar10 = pQVar9[1].qt_rgn;
            *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000001;
            pDVar3 = &(&pQVar10->rects)[lVar39].d;
            pDVar3->d = pDVar15;
            pDVar3->ptr = pQVar16;
            *(long *)(pQVar9 + 1) = *(long *)(pQVar9 + 1) + 1;
            pQVar41 = pQVar41 + 1;
          } while (pQVar41 < pQVar2);
        }
      }
      else if (0 < iVar14) {
        do {
          EVar5 = *pEVar40;
          if (EVar5 == CurveToElement) {
            pQVar9 = pQVar8[3].systemClip.d;
            ppQVar1 = &pQVar9->qt_rgn;
            pDVar15 = (Data *)pQVar41->xp;
            pQVar16 = (QRect *)pQVar41->yp;
            pDVar17 = (Data *)pQVar41[1].xp;
            pQVar18 = (QRect *)pQVar41[1].yp;
            pDVar19 = (Data *)pQVar41[2].xp;
            pQVar20 = (QRect *)pQVar41[2].yp;
            QDataBuffer<QStrokerOps::Element>::reserve
                      ((QDataBuffer<QStrokerOps::Element> *)ppQVar1,*(long *)(pQVar9 + 1) + 1);
            lVar39 = *(long *)(pQVar9 + 1);
            pQVar10 = pQVar9[1].qt_rgn;
            *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000002;
            pDVar3 = &(&pQVar10->rects)[lVar39].d;
            pDVar3->d = pDVar15;
            pDVar3->ptr = pQVar16;
            lVar39 = *(long *)(pQVar9 + 1);
            *(long *)(pQVar9 + 1) = lVar39 + 1;
            QDataBuffer<QStrokerOps::Element>::reserve
                      ((QDataBuffer<QStrokerOps::Element> *)ppQVar1,lVar39 + 2);
            lVar39 = *(long *)(pQVar9 + 1);
            pQVar10 = pQVar9[1].qt_rgn;
            *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000003;
            pDVar3 = &(&pQVar10->rects)[lVar39].d;
            pDVar3->d = pDVar17;
            pDVar3->ptr = pQVar18;
            lVar39 = *(long *)(pQVar9 + 1);
            *(long *)(pQVar9 + 1) = lVar39 + 1;
            QDataBuffer<QStrokerOps::Element>::reserve
                      ((QDataBuffer<QStrokerOps::Element> *)ppQVar1,lVar39 + 2);
            lVar39 = *(long *)(pQVar9 + 1);
            pQVar10 = pQVar9[1].qt_rgn;
            *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000003;
            pDVar3 = &(&pQVar10->rects)[lVar39].d;
            pDVar3->d = pDVar19;
            pDVar3->ptr = pQVar20;
            *(long *)(pQVar9 + 1) = *(long *)(pQVar9 + 1) + 1;
            pQVar41 = pQVar41 + 3;
            pEVar40 = pEVar40 + 3;
            local_1fc = local_1fc | 4;
          }
          else {
            if (EVar5 == LineToElement) {
              pQVar9 = pQVar8[3].systemClip.d;
              pDVar15 = (Data *)pQVar41->xp;
              pQVar16 = (QRect *)pQVar41->yp;
              QDataBuffer<QStrokerOps::Element>::reserve
                        ((QDataBuffer<QStrokerOps::Element> *)&pQVar9->qt_rgn,
                         *(long *)(pQVar9 + 1) + 1);
              lVar39 = *(long *)(pQVar9 + 1);
              pQVar10 = pQVar9[1].qt_rgn;
              *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000001;
              pDVar3 = &(&pQVar10->rects)[lVar39].d;
              pDVar3->d = pDVar15;
              pDVar3->ptr = pQVar16;
              *(long *)(pQVar9 + 1) = *(long *)(pQVar9 + 1) + 1;
            }
            else {
              if (EVar5 != MoveToElement) goto LAB_003cf92a;
              pQVar9 = pQVar8[3].systemClip.d;
              pDVar15 = (Data *)pQVar41->xp;
              pQVar16 = (QRect *)pQVar41->yp;
              if (1 < *(long *)(pQVar9 + 1)) {
                (**(code **)(*(long *)pQVar9 + 0x20))(pQVar9);
              }
              *(long *)(pQVar9 + 1) = 0;
              QDataBuffer<QStrokerOps::Element>::reserve
                        ((QDataBuffer<QStrokerOps::Element> *)&pQVar9->qt_rgn,1);
              lVar39 = *(long *)(pQVar9 + 1);
              pQVar10 = pQVar9[1].qt_rgn;
              *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000000;
              pDVar3 = &(&pQVar10->rects)[lVar39].d;
              pDVar3->d = pDVar15;
              pDVar3->ptr = pQVar16;
              *(long *)(pQVar9 + 1) = *(long *)(pQVar9 + 1) + 1;
            }
            pQVar41 = pQVar41 + 1;
            pEVar40 = pEVar40 + 1;
          }
LAB_003cf92a:
        } while (pQVar41 < pQVar2);
      }
      if ((path->m_hints & 0x4000) != 0) {
        pQVar9 = pQVar8[3].systemClip.d;
        pDVar15 = (Data *)*path->m_points;
        pQVar16 = (QRect *)path->m_points[1];
        QDataBuffer<QStrokerOps::Element>::reserve
                  ((QDataBuffer<QStrokerOps::Element> *)&pQVar9->qt_rgn,*(long *)(pQVar9 + 1) + 1);
        lVar39 = *(long *)(pQVar9 + 1);
        pQVar10 = pQVar9[1].qt_rgn;
        *(undefined8 *)(&pQVar10->numRects + lVar39 * 6) = 0xaaaaaaaa00000001;
        pDVar3 = &(&pQVar10->rects)[lVar39].d;
        pDVar3->d = pDVar15;
        pDVar3->ptr = pQVar16;
        *(long *)(pQVar9 + 1) = *(long *)(pQVar9 + 1) + 1;
      }
      (**(code **)(*(long *)pQVar8[3].systemClip.d + 0x18))();
      pQVar9 = pQVar8[3].baseSystemClip.d;
      if (*(long *)(pQVar9 + 2) == 0) goto LAB_003d0209;
      this_02 = (QVectorPath *)&local_88;
      local_88.m_matrix[1][0]._0_4_ = 0xffffffff;
      local_88.m_matrix[1][0]._4_4_ = 0xffffffff;
      local_88.m_matrix[1][1]._0_4_ = 0xffffffff;
      local_88.m_matrix[1][1]._4_4_ = 0xffffffff;
      local_88.m_matrix[1][2]._0_4_ = 0xffffffff;
      local_88.m_matrix[1][2]._4_4_ = 0xffffffff;
      local_88.m_matrix[2][0]._0_4_ = 0xffffffff;
      local_88.m_matrix[2][0]._4_4_ = 0xffffffff;
      local_88.m_matrix[2][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      local_88.m_matrix[0][1] = *(qreal *)(pQVar9 + 1);
      local_88.m_matrix[0][0] = (qreal)pQVar9[2].qt_rgn;
      local_88.m_matrix[0][2] =
           (qreal)CONCAT44(local_1fc,pQVar9[2].ref.atomic._q_value.super___atomic_base<int>._M_i);
      pQVar37 = &local_d8;
      QPen::brush((QPen *)pQVar37);
      (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x1a])(this,this_02,pQVar37);
    }
    QBrush::~QBrush((QBrush *)pQVar37);
    QVectorPath::~QVectorPath(this_02);
  }
LAB_003d0209:
  QPen::~QPen((QPen *)(local_198 + 8));
LAB_003d0216:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPaintEngineEx::stroke(const QVectorPath &path, const QPen &inPen)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << "QPaintEngineEx::stroke()" << inPen;
#endif

    Q_D(QPaintEngineEx);

    if (path.isEmpty())
        return;

    if (!d->strokeHandler) {
        d->strokeHandler = new StrokeHandler(path.elementCount()+4);
        d->stroker.setMoveToHook(qpaintengineex_moveTo);
        d->stroker.setLineToHook(qpaintengineex_lineTo);
        d->stroker.setCubicToHook(qpaintengineex_cubicTo);
    }

    QRectF clipRect;
    QPen pen = inPen;
    if (pen.style() > Qt::SolidLine) {
        QRectF cpRect = path.controlPointRect();
        const QTransform &xf = state()->matrix;
        if (pen.isCosmetic()) {
            clipRect = d->exDeviceRect;
            cpRect.translate(xf.dx(), xf.dy());
        } else {
            clipRect = xf.inverted().mapRect(QRectF(d->exDeviceRect));
        }
        // Check to avoid generating unwieldy amount of dashes that will not be visible anyway
        qreal pw = pen.widthF() ? pen.widthF() : 1;
        QRectF extentRect = cpRect.adjusted(-pw, -pw, pw, pw) & clipRect;
        qreal extent = qMax(extentRect.width(), extentRect.height());
        qreal patternLength = 0;
        const QList<qreal> pattern = pen.dashPattern();
        const int patternSize = qMin(pattern.size(), 32);
        for (int i = 0; i < patternSize; i++)
            patternLength += qMax(pattern.at(i), qreal(0));
        patternLength *= pw;
        if (qFuzzyIsNull(patternLength)) {
            pen.setStyle(Qt::NoPen);
        } else if (extent / patternLength > QDashStroker::repetitionLimit()) {
            // approximate stream of tiny dashes with semi-transparent solid line
            pen.setStyle(Qt::SolidLine);
            QColor color(pen.color());
            color.setAlpha(color.alpha() / 2);
            pen.setColor(color);
        }
    }

    if (!qpen_fast_equals(pen, d->strokerPen)) {
        d->strokerPen = pen;
        d->stroker.setJoinStyle(pen.joinStyle());
        d->stroker.setCapStyle(pen.capStyle());
        d->stroker.setMiterLimit(pen.miterLimit());
        qreal penWidth = pen.widthF();
        if (penWidth == 0)
            d->stroker.setStrokeWidth(1);
        else
            d->stroker.setStrokeWidth(penWidth);

        Qt::PenStyle style = pen.style();
        if (style == Qt::SolidLine) {
            d->activeStroker = &d->stroker;
        } else if (style == Qt::NoPen) {
            d->activeStroker = nullptr;
        } else {
            d->dasher.setDashPattern(pen.dashPattern());
            d->dasher.setDashOffset(pen.dashOffset());
            d->activeStroker = &d->dasher;
        }
    }

    if (!d->activeStroker) {
        return;
    }

    if (!clipRect.isNull())
        d->activeStroker->setClipRect(clipRect);

    if (d->activeStroker == &d->stroker)
        d->stroker.setForceOpen(path.hasExplicitOpen());

    const QPainterPath::ElementType *types = path.elements();
    const qreal *points = path.points();
    int pointCount = path.elementCount();

    const qreal *lastPoint = points + (pointCount<<1);

    d->strokeHandler->types.reset();
    d->strokeHandler->pts.reset();

    // Some engines might decide to optimize for the non-shape hint later on...
    uint flags = QVectorPath::WindingFill;

    if (path.elementCount() > 2)
        flags |= QVectorPath::NonConvexShapeMask;

    if (d->stroker.capStyle() == Qt::RoundCap || d->stroker.joinStyle() == Qt::RoundJoin)
        flags |= QVectorPath::CurvedShapeMask;

    // ### Perspective Xforms are currently not supported...
    if (!pen.isCosmetic()) {
        // We include cosmetic pens in this case to avoid having to
        // change the current transform. Normal transformed,
        // non-cosmetic pens will be transformed as part of fill
        // later, so they are also covered here..
        d->activeStroker->setCurveThresholdFromTransform(state()->matrix);
        d->activeStroker->begin(d->strokeHandler);
        if (types) {
            while (points < lastPoint) {
                switch (*types) {
                case QPainterPath::MoveToElement:
                    d->activeStroker->moveTo(points[0], points[1]);
                    points += 2;
                    ++types;
                    break;
                case QPainterPath::LineToElement:
                    d->activeStroker->lineTo(points[0], points[1]);
                    points += 2;
                    ++types;
                    break;
                case QPainterPath::CurveToElement:
                    d->activeStroker->cubicTo(points[0], points[1],
                                              points[2], points[3],
                                              points[4], points[5]);
                    points += 6;
                    types += 3;
                    flags |= QVectorPath::CurvedShapeMask;
                    break;
                default:
                    break;
                }
            }
            if (path.hasImplicitClose())
                d->activeStroker->lineTo(path.points()[0], path.points()[1]);

        } else {
            d->activeStroker->moveTo(points[0], points[1]);
            points += 2;
            while (points < lastPoint) {
                d->activeStroker->lineTo(points[0], points[1]);
                points += 2;
            }
            if (path.hasImplicitClose())
                d->activeStroker->lineTo(path.points()[0], path.points()[1]);
        }
        d->activeStroker->end();

        if (!d->strokeHandler->types.size()) // an empty path...
            return;

        QVectorPath strokePath(d->strokeHandler->pts.data(),
                               d->strokeHandler->types.size(),
                               d->strokeHandler->types.data(),
                               flags);
        fill(strokePath, pen.brush());
    } else {
        // For cosmetic pens we need a bit of trickery... We to process xform the input points
        if (state()->matrix.type() >= QTransform::TxProject) {
            QPainterPath painterPath = state()->matrix.map(path.convertToPainterPath());
            d->activeStroker->strokePath(painterPath, d->strokeHandler, QTransform());
        } else {
            d->activeStroker->setCurveThresholdFromTransform(QTransform());
            d->activeStroker->begin(d->strokeHandler);
            if (types) {
                while (points < lastPoint) {
                    switch (*types) {
                    case QPainterPath::MoveToElement: {
                        QPointF pt = (*(const QPointF *) points) * state()->matrix;
                        d->activeStroker->moveTo(pt.x(), pt.y());
                        points += 2;
                        ++types;
                        break;
                    }
                    case QPainterPath::LineToElement: {
                        QPointF pt = (*(const QPointF *) points) * state()->matrix;
                        d->activeStroker->lineTo(pt.x(), pt.y());
                        points += 2;
                        ++types;
                        break;
                    }
                    case QPainterPath::CurveToElement: {
                        QPointF c1 = ((const QPointF *) points)[0] * state()->matrix;
                        QPointF c2 = ((const QPointF *) points)[1] * state()->matrix;
                        QPointF e =  ((const QPointF *) points)[2] * state()->matrix;
                        d->activeStroker->cubicTo(c1.x(), c1.y(), c2.x(), c2.y(), e.x(), e.y());
                        points += 6;
                        types += 3;
                        flags |= QVectorPath::CurvedShapeMask;
                        break;
                    }
                    default:
                        break;
                    }
                }
                if (path.hasImplicitClose()) {
                    QPointF pt = * ((const QPointF *) path.points()) * state()->matrix;
                    d->activeStroker->lineTo(pt.x(), pt.y());
                }

            } else {
                QPointF p = ((const QPointF *)points)[0] * state()->matrix;
                d->activeStroker->moveTo(p.x(), p.y());
                points += 2;
                while (points < lastPoint) {
                    QPointF p = ((const QPointF *)points)[0] * state()->matrix;
                    d->activeStroker->lineTo(p.x(), p.y());
                    points += 2;
                }
                if (path.hasImplicitClose())
                    d->activeStroker->lineTo(p.x(), p.y());
            }
            d->activeStroker->end();
        }

        QVectorPath strokePath(d->strokeHandler->pts.data(),
                               d->strokeHandler->types.size(),
                               d->strokeHandler->types.data(),
                               flags);

        QTransform xform = state()->matrix;
        state()->matrix = QTransform();
        transformChanged();

        QBrush brush = pen.brush();
        if (qbrush_style(brush) != Qt::SolidPattern)
            brush.setTransform(brush.transform() * xform);

        fill(strokePath, brush);

        state()->matrix = xform;
        transformChanged();
    }
}